

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int cbs_get_any_asn1_element
              (CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag,size_t *out_header_len,int *out_ber_found,
              int *out_indefinite,int ber_ok)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong local_88;
  uint64_t len64;
  size_t num_bytes;
  size_t len;
  size_t header_len;
  uint8_t length_byte;
  CBS_ASN1_TAG tag;
  CBS throwaway;
  CBS header;
  int *out_indefinite_local;
  int *out_ber_found_local;
  size_t *out_header_len_local;
  CBS_ASN1_TAG *out_tag_local;
  CBS *out_local;
  CBS *cbs_local;
  
  throwaway.len = (size_t)cbs->data;
  out_tag_local = (CBS_ASN1_TAG *)out;
  if (out == (CBS *)0x0) {
    out_tag_local = (CBS_ASN1_TAG *)&stack0xffffffffffffffa0;
  }
  if (ber_ok == 0) {
    if (out_ber_found != (int *)0x0) {
      __assert_fail("out_ber_found == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x13f,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
    if (out_indefinite != (int *)0x0) {
      __assert_fail("out_indefinite == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x140,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
  }
  else {
    *out_ber_found = 0;
    *out_indefinite = 0;
  }
  iVar1 = parse_asn1_tag((CBS *)&throwaway.len,(CBS_ASN1_TAG *)((long)&header_len + 4));
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (out_tag != (CBS_ASN1_TAG *)0x0) {
      *out_tag = header_len._4_4_;
    }
    iVar1 = CBS_get_u8((CBS *)&throwaway.len,(uint8_t *)((long)&header_len + 3));
    if (iVar1 == 0) {
      cbs_local._4_4_ = 0;
    }
    else {
      sVar2 = CBS_len(cbs);
      sVar3 = CBS_len((CBS *)&throwaway.len);
      len = sVar2 - sVar3;
      if ((header_len._3_1_ & 0x80) == 0) {
        num_bytes = header_len._3_1_ + len;
        if (out_header_len != (size_t *)0x0) {
          *out_header_len = len;
        }
      }
      else {
        len64 = (uint64_t)(int)(header_len._3_1_ & 0x7f);
        if (((ber_ok != 0) && ((header_len._4_4_ & 0x20000000) != 0)) && (len64 == 0)) {
          if (out_header_len != (size_t *)0x0) {
            *out_header_len = len;
          }
          *out_ber_found = 1;
          *out_indefinite = 1;
          iVar1 = CBS_get_bytes(cbs,(CBS *)out_tag_local,len);
          return iVar1;
        }
        if ((len64 == 0) || (4 < len64)) {
          return 0;
        }
        iVar1 = cbs_get_u((CBS *)&throwaway.len,&local_88,len64);
        if (iVar1 == 0) {
          return 0;
        }
        if (local_88 < 0x80) {
          if (ber_ok == 0) {
            return 0;
          }
          *out_ber_found = 1;
        }
        if (local_88 >> (((char)len64 + -1) * '\b' & 0x3fU) == 0) {
          if (ber_ok == 0) {
            return 0;
          }
          *out_ber_found = 1;
        }
        if (local_88 + len + len64 < local_88) {
          return 0;
        }
        num_bytes = len + len64 + local_88;
        if (out_header_len != (size_t *)0x0) {
          *out_header_len = len + len64;
        }
      }
      cbs_local._4_4_ = CBS_get_bytes(cbs,(CBS *)out_tag_local,num_bytes);
    }
  }
  return cbs_local._4_4_;
}

Assistant:

static int cbs_get_any_asn1_element(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag,
                                    size_t *out_header_len, int *out_ber_found,
                                    int *out_indefinite, int ber_ok) {
  CBS header = *cbs;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }
  if (ber_ok) {
    *out_ber_found = 0;
    *out_indefinite = 0;
  } else {
    assert(out_ber_found == NULL);
    assert(out_indefinite == NULL);
  }

  CBS_ASN1_TAG tag;
  if (!parse_asn1_tag(&header, &tag)) {
    return 0;
  }
  if (out_tag != NULL) {
    *out_tag = tag;
  }

  uint8_t length_byte;
  if (!CBS_get_u8(&header, &length_byte)) {
    return 0;
  }

  size_t header_len = CBS_len(cbs) - CBS_len(&header);

  size_t len;
  // The format for the length encoding is specified in ITU-T X.690 section
  // 8.1.3.
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = ((size_t)length_byte) + header_len;
    if (out_header_len != NULL) {
      *out_header_len = header_len;
    }
  } else {
    // The high bit indicate that this is the long form, while the next 7 bits
    // encode the number of subsequent octets used to encode the length (ITU-T
    // X.690 clause 8.1.3.5.b).
    const size_t num_bytes = length_byte & 0x7f;
    uint64_t len64;

    if (ber_ok && (tag & CBS_ASN1_CONSTRUCTED) != 0 && num_bytes == 0) {
      // indefinite length
      if (out_header_len != NULL) {
        *out_header_len = header_len;
      }
      *out_ber_found = 1;
      *out_indefinite = 1;
      return CBS_get_bytes(cbs, out, header_len);
    }

    // ITU-T X.690 clause 8.1.3.5.c specifies that the value 0xff shall not be
    // used as the first byte of the length. If this parser encounters that
    // value, num_bytes will be parsed as 127, which will fail this check.
    if (num_bytes == 0 || num_bytes > 4) {
      return 0;
    }
    if (!cbs_get_u(&header, &len64, num_bytes)) {
      return 0;
    }
    // ITU-T X.690 section 10.1 (DER length forms) requires encoding the
    // length with the minimum number of octets. BER could, technically, have
    // 125 superfluous zero bytes. We do not attempt to handle that and still
    // require that the length fit in a |uint32_t| for BER.
    if (len64 < 128) {
      // Length should have used short-form encoding.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    if ((len64 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    len = len64;
    if (len + header_len + num_bytes < len) {
      // Overflow.
      return 0;
    }
    len += header_len + num_bytes;
    if (out_header_len != NULL) {
      *out_header_len = header_len + num_bytes;
    }
  }

  return CBS_get_bytes(cbs, out, len);
}